

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint64_t farmhashuo::Hash64WithSeeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong local_58;
  
  if (len < 0x41) {
    uVar5 = farmhashna::Hash64(s,len);
    uVar7 = (uVar5 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar7 = (uVar7 >> 0x2f ^ seed1 ^ uVar7) * -0x622015f714c7d297;
    uVar5 = (uVar7 >> 0x2f ^ uVar7) * -0x622015f714c7d297;
  }
  else {
    lVar14 = 0;
    lVar17 = seed0 * -0x651e95c4d06fbfb1;
    lVar15 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar7 = (ulong)(lVar15 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar15 * -0x651e95c4d06fbfb1;
    local_58 = uVar7 * -0x651e95c4d06fbfb1;
    lVar23 = seed0 + uVar7 * 0x651e95c4d06fbfb1;
    uVar7 = 0;
    lVar6 = (ulong)((uint)lVar23 & 0x82) + 0x9ae16a3b2f90404f;
    uVar13 = (ulong)((uint)(len - 1) & 0x3f);
    plVar8 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    do {
      plVar1 = (long *)((long)s + 0x18);
      lVar4 = *(long *)((long)s + 0x30);
      lVar19 = *(long *)((long)s + 8);
      uVar11 = (local_58 + *plVar1) * lVar6;
      lVar9 = uVar7 + *(long *)((long)s + 0x38);
      uVar7 = lVar15 + *(long *)((long)s + 0x10);
      uVar18 = lVar17 + *(long *)s + lVar19;
      lVar15 = lVar23 + *(long *)((long)s + 0x38);
      lVar12 = (uVar11 >> 0x20 | uVar11 << 0x20) + lVar9;
      lVar23 = *(long *)s + lVar4 + lVar12 * 9;
      plVar2 = (long *)((long)s + 0x20);
      uVar11 = seed0 + *plVar2;
      lVar22 = (uVar11 >> 0x21 | uVar11 * 0x80000000) + *(long *)((long)s + 0x10);
      plVar3 = (long *)((long)s + 0x28);
      s = (char *)((long)s + 0x40);
      uVar11 = seed1 + lVar19 + *plVar3;
      local_58 = uVar7 >> 0x1d | uVar7 << 0x23;
      lVar15 = lVar15 + lVar22;
      uVar7 = (uVar18 >> 0x1a | uVar18 << 0x26) * 9;
      lVar19 = uVar7 + lVar19;
      lVar17 = lVar19 - lVar15;
      uVar18 = lVar4 + *plVar3 + lVar9 + lVar12 + lVar17;
      seed0 = lVar22 + lVar17;
      lVar14 = (lVar14 + lVar4 ^ uVar7) * 9 + *plVar2;
      lVar17 = lVar19 + uVar18;
      uVar7 = uVar18 >> 0x22 | uVar18 * 0x40000000;
      seed1 = (uVar11 >> 0x1e | uVar11 << 0x22) + *plVar1 + lVar14;
      lVar14 = lVar14 + seed1;
    } while ((long *)s != plVar8);
    uVar24 = seed1 >> 0x1c | seed1 << 0x24;
    uVar10 = seed0 >> 0x14 | seed0 << 0x2c;
    lVar22 = lVar23 * 9 + lVar15;
    uVar16 = lVar15 + lVar22;
    lVar15 = *(long *)((long)plVar8 + (uVar13 - 0x37));
    lVar23 = *(long *)((long)plVar8 + (uVar13 - 0x17));
    lVar25 = uVar24 * lVar6 + *(long *)((long)plVar8 + (uVar13 - 0x3f));
    uVar18 = (uVar10 - lVar17) + lVar15 + uVar16;
    uVar11 = *(ulong *)((long)plVar8 + (uVar13 - 0xf));
    uVar18 = uVar7 * 9 ^ (uVar18 >> 0x25 | uVar18 * 0x8000000) * lVar6;
    uVar16 = uVar24 ^ uVar11 ^ uVar16;
    local_58 = local_58 + lVar14 + uVar13;
    uVar24 = local_58 >> 0x21 | local_58 * 0x80000000;
    lVar17 = *(long *)((long)plVar8 + (uVar13 - 0x2f));
    lVar12 = uVar24 * lVar6;
    uVar10 = uVar10 + lVar23 + (uVar16 >> 0x2a | uVar16 << 0x16) * lVar6;
    lVar19 = uVar7 + lVar12 + *(long *)((long)plVar8 + (uVar13 - 0x1f));
    lVar4 = *(long *)((long)plVar8 + (uVar13 - 7));
    lVar9 = *(long *)((long)plVar8 + (uVar13 - 0x27)) + uVar18;
    uVar20 = lVar15 + lVar17 + lVar25;
    uVar16 = lVar14 + uVar13 + lVar25 + lVar9;
    uVar7 = lVar23 + uVar11 + lVar19;
    uVar13 = lVar17 + uVar10 + lVar4 + lVar19;
    uVar11 = uVar7 + lVar4 ^ uVar10;
    uVar13 = lVar19 + lVar12 + (uVar7 >> 0x2c | uVar7 * 0x100000) +
             (uVar13 >> 0x15 | uVar13 << 0x2b);
    uVar21 = (uVar20 + lVar9 ^ uVar11) * lVar6;
    uVar7 = ((uVar20 >> 0x2c | uVar20 * 0x100000) + lVar25 + uVar10 +
             (uVar16 >> 0x15 | uVar16 << 0x2b) ^ uVar13) * -0x651e95c4d06fbfb1;
    uVar11 = (uVar21 >> 0x2f ^ uVar11 ^ uVar21) * lVar6;
    uVar7 = uVar7 >> 0x2f ^ uVar13 ^ uVar7;
    uVar18 = (uVar7 * -0x41befec400000000 | uVar7 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar18;
    uVar7 = (((uVar11 >> 0x2f ^ uVar11) + uVar24) * lVar6 - lVar22 ^ uVar18) * -0x651e95c4d06fbfb1;
    uVar7 = uVar7 >> 0x2f ^ uVar18 ^ uVar7;
    uVar5 = (uVar7 * 0x5f20809e00000000 | uVar7 * -0x651e95c4d06fbfb1 >> 0x1f) * -0x651e95c4d06fbfb1
    ;
  }
  return uVar5;
}

Assistant:

uint64_t Hash64WithSeeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhashna::Hash64WithSeeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = farmhashna::ShiftMix(y * k2) * k2;
  pair<uint64_t, uint64_t> v = make_pair(seed0, seed1);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = Fetch(s);
    uint64_t a1 = Fetch(s + 8);
    uint64_t a2 = Fetch(s + 16);
    uint64_t a3 = Fetch(s + 24);
    uint64_t a4 = Fetch(s + 32);
    uint64_t a5 = Fetch(s + 40);
    uint64_t a6 = Fetch(s + 48);
    uint64_t a7 = Fetch(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.first += a4;
    v.second += a5 + a1;
    w.first += a6;
    w.second += a7;

    x = Rotate(x, 26);
    x *= 9;
    y = Rotate(y, 29);
    z *= mul;
    v.first = Rotate(v.first, 33);
    v.second = Rotate(v.second, 30);
    w.first ^= x;
    w.first *= 9;
    z = Rotate(z, 32);
    z += w.second;
    w.second += z;
    z *= 9;
    std::swap(u, y);

    z += a0 + a6;
    v.first += a2;
    v.second += a3;
    w.first += a4;
    w.second += a5 + a6;
    x += a1;
    y += a7;

    y += v.first;
    v.first += x - y;
    v.second += w.first;
    w.first += v.second;
    w.second += x - y;
    x += w.second;
    w.second = Rotate(w.second, 34);
    std::swap(u, z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.second = Rotate(v.second, 28);
  v.first = Rotate(v.first, 20);
  w.first += ((len - 1) & 63);
  u += y;
  y += u;
  x = Rotate(y - x + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y ^ v.second ^ Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = farmhashna::WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = farmhashna::WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  return H(farmhashna::HashLen16(v.first + x, w.first ^ y, mul) + z - u,
           H(v.second + y, w.second + z, k2, 30) ^ x,
           k2,
           31);
}